

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O3

string * __thiscall efsw::String::toUtf8_abi_cxx11_(string *__return_storage_ptr__,String *this)

{
  pointer pcVar1;
  size_type sVar2;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  output;
  pointer pcVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  sVar2 = (this->mString)._M_string_length;
  if (0 < (long)sVar2) {
    pcVar3 = (this->mString)._M_dataplus._M_p;
    pcVar1 = pcVar3 + sVar2;
    output.container = __return_storage_ptr__;
    do {
      output = Utf<8u>::Encode<std::back_insert_iterator<std::__cxx11::string>>(*pcVar3,output,'\0')
      ;
      pcVar3 = pcVar3 + 1;
    } while (pcVar3 < pcVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string String::toUtf8() const {
	// Prepare the output string
	std::string output;
	output.reserve( mString.length() + 1 );

	// Convert
	Utf32::toUtf8( mString.begin(), mString.end(), std::back_inserter( output ) );

	return output;
}